

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  Resource *t_local;
  SmallVector<Resource,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<Resource>).buffer_size + 1);
  CompilerMSL::entry_point_args_discrete_descriptors::Resource::Resource
            ((this->super_VectorView<Resource>).ptr + (this->super_VectorView<Resource>).buffer_size
             ,t);
  (this->super_VectorView<Resource>).buffer_size =
       (this->super_VectorView<Resource>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}